

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O3

btScalar __thiscall
btJacobianEntry::getNonDiagonal
          (btJacobianEntry *this,btJacobianEntry *jacB,btScalar massInvA,btScalar massInvB)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = (this->m_linearJointAxis).m_floats[1] * (jacB->m_linearJointAxis).m_floats[1];
  fVar2 = (jacB->m_linearJointAxis).m_floats[0] * (this->m_linearJointAxis).m_floats[0];
  fVar3 = (jacB->m_linearJointAxis).m_floats[2] * (this->m_linearJointAxis).m_floats[2];
  return massInvA * fVar3 +
         (jacB->m_bJ).m_floats[2] * (this->m_1MinvJt).m_floats[2] +
         (jacB->m_aJ).m_floats[2] * (this->m_0MinvJt).m_floats[2] + fVar3 * massInvB +
         fVar1 * massInvB +
         fVar1 * massInvA +
         (this->m_1MinvJt).m_floats[1] * (jacB->m_bJ).m_floats[1] +
         (this->m_0MinvJt).m_floats[1] * (jacB->m_aJ).m_floats[1] +
         massInvA * fVar2 +
         (jacB->m_bJ).m_floats[0] * (this->m_1MinvJt).m_floats[0] +
         (jacB->m_aJ).m_floats[0] * (this->m_0MinvJt).m_floats[0] + fVar2 * massInvB;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator*(const btVector3& v1, const btVector3& v2)
{
#if defined(BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
	return btVector3(_mm_mul_ps(v1.mVec128, v2.mVec128));
#elif defined(BT_USE_NEON)
	return btVector3(vmulq_f32(v1.mVec128, v2.mVec128));
#else
	return btVector3(
			v1.m_floats[0] * v2.m_floats[0],
			v1.m_floats[1] * v2.m_floats[1],
			v1.m_floats[2] * v2.m_floats[2]);
#endif
}